

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_merge_sort_tree.cpp
# Opt level: O1

void __thiscall
duckdb::WindowMergeSortTreeLocalState::WindowMergeSortTreeLocalState
          (WindowMergeSortTreeLocalState *this,WindowMergeSortTree *window_tree)

{
  ClientContext *pCVar1;
  Allocator *allocator;
  pointer pGVar2;
  optional_ptr<duckdb::LocalSortState,_true> oVar3;
  
  (this->super_WindowAggregatorState)._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowAggregatorState_024ad8d8;
  allocator = Allocator::DefaultAllocator();
  ArenaAllocator::ArenaAllocator(&(this->super_WindowAggregatorState).allocator,allocator,0x800);
  (this->super_WindowAggregatorState)._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowMergeSortTreeLocalState_024ad980;
  this->window_tree = window_tree;
  (this->local_sort).ptr = (LocalSortState *)0x0;
  DataChunk::DataChunk(&this->sort_chunk);
  DataChunk::DataChunk(&this->payload_chunk);
  this->build_stage = INIT;
  pCVar1 = window_tree->context;
  pGVar2 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(&window_tree->global_sort);
  DataChunk::Initialize(&this->sort_chunk,pCVar1,&(pGVar2->sort_layout).logical_types,0x800);
  pCVar1 = window_tree->context;
  pGVar2 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(&window_tree->global_sort);
  DataChunk::Initialize(&this->payload_chunk,pCVar1,&(pGVar2->payload_layout).types,0x800);
  oVar3 = WindowMergeSortTree::AddLocalSort(window_tree);
  (this->local_sort).ptr = oVar3.ptr;
  return;
}

Assistant:

WindowMergeSortTreeLocalState::WindowMergeSortTreeLocalState(WindowMergeSortTree &window_tree)
    : window_tree(window_tree) {
	sort_chunk.Initialize(window_tree.context, window_tree.global_sort->sort_layout.logical_types);
	payload_chunk.Initialize(window_tree.context, window_tree.global_sort->payload_layout.GetTypes());
	local_sort = window_tree.AddLocalSort();
}